

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restclient.cpp
# Opt level: O3

string * __thiscall
YdiskRestClient::url_encode(string *__return_storage_ptr__,YdiskRestClient *this,string *s)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  char hex [4];
  char local_34 [4];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  lVar3 = 0;
  do {
    bVar1 = (s->_M_dataplus)._M_p[lVar3];
    uVar4 = (uint)bVar1;
    if (bVar1 < 0x27) {
      if ((bVar1 != 0x20) && (uVar4 != 0x23)) {
        if (uVar4 == 0) {
          return __return_storage_ptr__;
        }
        goto switchD_0013e3f1_caseD_28;
      }
      goto switchD_0013e3f1_caseD_2b;
    }
    switch(bVar1) {
    case 0x27:
      break;
    case 0x28:
    case 0x29:
    case 0x2a:
    case 0x2d:
    case 0x2e:
switchD_0013e3f1_caseD_28:
      if ((char)bVar1 < '\0') {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        iVar2 = snprintf(local_34,3,"%02X",(ulong)uVar4);
        if (iVar2 != 2) {
          __assert_fail("len == 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/ivanenko[P]ydisk_commander/restclient.cpp"
                        ,0x1ad,"std::string YdiskRestClient::url_encode(const std::string &)");
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)local_34);
      }
      else {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      goto LAB_0013e450;
    case 0x2b:
      break;
    case 0x2c:
      break;
    case 0x2f:
      break;
    default:
      if ((uVar4 != 0x3a) && (uVar4 != 0x3b)) goto switchD_0013e3f1_caseD_28;
    }
switchD_0013e3f1_caseD_2b:
    std::__cxx11::string::append((char *)__return_storage_ptr__);
LAB_0013e450:
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

std::string YdiskRestClient::url_encode(const std::string& s)
{
    std::string result;

    for (auto i = 0; s[i]; i++) {
        switch (s[i]) {
            case ' ':  result += "%20"; break;
            case '+':  result += "%2B"; break;
            case '/':  result += "%2F"; break;
            case '\'': result += "%27"; break;
            case ',':  result += "%2C"; break;
            case ':':  result += "%3A"; break;
            case ';':  result += "%3B"; break;
            case '#':  result += "%23"; break;
            default:
                auto c = static_cast<uint8_t>(s[i]);
                if (c >= 0x80) {
                    result += '%';
                    char hex[4];
                    size_t len = snprintf(hex, sizeof(hex) - 1, "%02X", c);
                    assert(len == 2);
                    result.append(hex, len);
                } else {
                    result += s[i];
                }
                break;
        }
    }

    return result;
}